

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O0

int __thiscall hanabi_learning_env::HanabiState::Score(HanabiState *this)

{
  int iVar1;
  const_iterator __first;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  undefined4 local_4;
  
  iVar1 = LifeTokens((HanabiState *)in_RDI._M_current);
  if (iVar1 < 1) {
    local_4 = 0;
  }
  else {
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)in_RDI._M_current);
    __first = std::vector<int,_std::allocator<int>_>::end(in_RDI._M_current);
    local_4 = std::
              accumulate<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                         __first._M_current,in_RDI,0);
  }
  return local_4;
}

Assistant:

int HanabiState::Score() const {
  if (LifeTokens() <= 0) {
    return 0;
  }
  return std::accumulate(fireworks_.begin(), fireworks_.end(), 0);
}